

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_server.hpp
# Opt level: O3

error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
* __thiscall
pstore::http::
send_message<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
          (error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
           *__return_storage_ptr__,http *this,
          _func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
          *sender,reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                  io,opcode op,span<const_unsigned_char,__1L> *span)

{
  ulong uVar1;
  uint uVar2;
  reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_> io_00;
  undefined4 in_register_00000084;
  frame_fixed_layout *f;
  frame_fixed_layout *pfVar3;
  anon_class_16_2_9095cc0e f_00;
  ushort local_3a;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  local_38;
  
  f = (frame_fixed_layout *)CONCAT44(in_register_00000084,op);
  uVar2 = ((uint)io._M_data & 0xf) << 8;
  uVar1 = *(ulong *)f;
  if ((long)uVar1 < 0x7e) {
    io_00._M_data._4_4_ = 0;
    io_00._M_data._0_4_ = (uint)uVar1 & 0x7f | uVar2 | 0x8000;
    pfVar3 = f;
    send<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,unsigned_short,void>
              (&local_38,this,sender,io_00,(unsigned_short)op);
    f_00.span = (span<const_unsigned_char,__1L> *)pfVar3;
    f_00.sender = (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                   *)f;
    pstore::operator>>=(__return_storage_ptr__,(pstore *)&local_38,
                        (error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
                         *)this,f_00);
    if (local_38.has_error_ == false) {
      error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
      ::
      value_storage_impl<pstore::error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>&,std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                (&local_38);
    }
    else {
      error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
      ::
      error_storage_impl<pstore::error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>&,std::error_code>
                (&local_38);
    }
  }
  else {
    local_3a = (ushort)uVar2;
    if (uVar1 < 0x10000) {
      local_3a = local_3a | 0x807e;
      details::
      send_extended_length_message<unsigned_short,pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                (__return_storage_ptr__,(details *)this,sender,
                 (descriptor<pstore::details::posix_descriptor_traits> *)&local_3a,f,span);
    }
    else {
      local_3a = local_3a | 0x807f;
      details::
      send_extended_length_message<unsigned_long,pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                (__return_storage_ptr__,(details *)this,sender,
                 (descriptor<pstore::details::posix_descriptor_traits> *)&local_3a,f,span);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

error_or<IO> send_message (Sender const sender, IO const io, opcode const op,
                                   gsl::span<std::uint8_t const> const & span) {
            frame_fixed_layout f{};
            f.fin = true;
            f.rsv = std::uint16_t{0};
            f.opcode = static_cast<std::uint16_t> (op);
            f.mask = false;

            auto const length = span.size ();
            if (length < 126) {
                f.payload_length = static_cast<std::uint16_t> (length);
                return send (sender, io, f.raw) >>=
                       [sender, &span] (IO io2) { return send (sender, io2, span); };
            }

            if (length <= std::numeric_limits<std::uint16_t>::max ()) {
                // Length is sent as 16-bits.
                f.payload_length = std::uint16_t{126};
                return details::send_extended_length_message<std::uint16_t> (sender, io, f, span);
            }

            // The payload length must not have the top bit set.
            if (static_cast<std::uint64_t> (length) & (std::uint64_t{1} << 63U)) {
                return error_or<IO>{make_error_code (ws_error::message_too_long)};
            }

            // Send the length as a full 64-bit value.
            f.payload_length = std::uint16_t{127};
            return details::send_extended_length_message<std::uint64_t> (sender, io, f, span);
        }